

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint64_t mpidr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = env->features;
  uVar1 = (uint)uVar3;
  if ((uVar1 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 == 0x10) {
        uVar2 = 0;
      }
      else if (uVar2 == 0x16) {
LAB_00612439:
        uVar2 = 3;
      }
      else if (uVar2 == 0x1a) {
        uVar2 = 2;
      }
      else {
        if ((uVar3 & 0x200000000) != 0) {
          if (uVar2 == 0x16) {
            uVar2 = 3;
            if ((uVar1 >> 0x1c & 1) == 0) goto LAB_0061243e;
          }
          else if ((uVar3 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_00612439;
        }
        uVar2 = 1;
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar2 = 1;
    if ((env->v7m).exception == 0) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0061243e:
  if ((uVar3 & 0x200000000) == 0) {
    bVar4 = false;
  }
  else {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) == 0x16) goto LAB_0061248e;
    }
    else if ((~env->pstate & 0xc) == 0) goto LAB_0061248e;
    bVar4 = ((env->cp15).scr_el3 & 1) == 0;
  }
  if ((((uVar3 >> 0x20 & 1) != 0) && (!bVar4)) && (uVar2 == 1)) {
    return (env->cp15).vmpidr_el2;
  }
LAB_0061248e:
  if ((uVar1 >> 0xc & 1) != 0) {
    uVar3 = 0xc0000000;
    if (*(char *)((long)env[1].xregs + 0x2c) == '\0') {
      uVar3 = 0x80000000;
    }
    return *(ulong *)&env[1].spsr | uVar3;
  }
  return *(ulong *)&env[1].spsr;
}

Assistant:

static uint64_t mpidr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    unsigned int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);

    if (arm_feature(env, ARM_FEATURE_EL2) && !secure && cur_el == 1) {
        return env->cp15.vmpidr_el2;
    }
    return mpidr_read_val(env);
}